

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O2

string * conv(string *__return_storage_ptr__,string *l,size_t i)

{
  char cVar1;
  ostream *this;
  char *pcVar2;
  ostringstream ss;
  
  if (i < l->_M_string_length) {
    cVar1 = (l->_M_dataplus)._M_p[i];
    if (cVar1 != '\n') {
      if (cVar1 < ' ') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        this = std::operator<<((ostream *)&ss,"\\x");
        *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) =
             *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)this,(int)(l->_M_dataplus)._M_p[i]);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)l);
      return __return_storage_ptr__;
    }
    pcVar2 = "\\n";
  }
  else {
    pcVar2 = "---";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string conv(std::string const &l,size_t i)
{
	if(i >= l.size()) {
		return "---";
	}
	if(l[i] == '\n')
		return "\\n";
	if(l[i] < 32) {
		std::ostringstream ss;
		ss <<"\\x" << std::hex << (int)(l[i]);
		return ss.str();
	}
	else {
		return l.substr(i,1);
	}
}